

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

void __thiscall
notch::core::ConvolutionLayer2D<3UL>::outputInplace
          (ConvolutionLayer2D<3UL> *this,Array *inputImages)

{
  size_t imageHeight;
  bool bVar1;
  size_t sVar2;
  element_type *__va;
  element_type *__va_00;
  float *image;
  float *kernel_00;
  float *result;
  Array *out;
  Array *kernel;
  Array *inputImages_local;
  ConvolutionLayer2D<3UL> *this_local;
  
  sVar2 = std::valarray<float>::size(inputImages);
  if (sVar2 != this->inputSize) {
    __assert_fail("inputImages.size() == inputSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                  ,0x6a3,
                  "void notch::ConvolutionLayer2D<>::outputInplace(const Array &) [kernelSize = 3]")
    ;
  }
  bVar1 = ::std::operator!=(&(this->super_ABackpropLayer).shared.outputBuffer,(nullptr_t)0x0);
  if (!bVar1) {
    __assert_fail("shared.outputBuffer != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                  ,0x6a4,
                  "void notch::ConvolutionLayer2D<>::outputInplace(const Array &) [kernelSize = 3]")
    ;
  }
  __va = std::__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator*((__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&this->weights);
  __va_00 = std::__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_ABackpropLayer).shared.outputBuffer);
  image = std::begin<float>(inputImages);
  sVar2 = this->inputWidth;
  imageHeight = this->inputHeight;
  kernel_00 = std::begin<float>(__va);
  result = std::begin<float>(__va_00);
  internal::conv2d<3ul,float_const*,float*>(image,sVar2,imageHeight,kernel_00,result);
  return;
}

Assistant:

void outputInplace(const Array &inputImages) {
        assert(inputImages.size() == inputSize); // TODO: implement multiplane input
        assert(shared.outputBuffer != nullptr);
        const Array &kernel = *weights;
        Array &out = *shared.outputBuffer;
        internal::conv2d<kernelSize>
                         (std::begin(inputImages),
                          inputWidth, inputHeight,
                          std::begin(kernel), std::begin(out));
    }